

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_bonsai_trie.hpp
# Opt level: O0

uint64_t __thiscall
poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::find_child
          (plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *this,uint64_t node_id,uint64_t symb)

{
  uint64_t x;
  plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *this_00;
  uint64_t uVar1;
  ulong i_00;
  plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *in_RDI;
  uint64_t i;
  uint64_t key;
  uint64_t in_stack_ffffffffffffffb8;
  uint64_t in_stack_ffffffffffffffc0;
  plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *in_stack_ffffffffffffffd0;
  ulong uVar2;
  
  if (in_RDI->size_ == 0) {
    return 0xffffffffffffffff;
  }
  x = make_key_(in_stack_ffffffffffffffd0,(uint64_t)in_RDI,in_stack_ffffffffffffffc0);
  this_00 = (plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *)hash::vigna_hasher::hash(x);
  uVar1 = size_p2::mask(&in_RDI->capa_size_);
  i_00 = (ulong)this_00 & uVar1;
  do {
    if ((i_00 != 0) &&
       (uVar2 = i_00, uVar1 = get_root(in_RDI), in_stack_ffffffffffffffb8 = i_00, i_00 != uVar1)) {
      uVar1 = compact_vector::operator[](&this_00->table_,i_00);
      if (uVar1 == 0) {
        return 0xffffffffffffffff;
      }
      uVar1 = compact_vector::operator[](&this_00->table_,i_00);
      in_stack_ffffffffffffffb8 = i_00;
      if (uVar1 == x) {
        return uVar2;
      }
    }
    i_00 = right_(this_00,in_stack_ffffffffffffffb8);
  } while( true );
}

Assistant:

uint64_t find_child(uint64_t node_id, uint64_t symb) const {
        assert(node_id < capa_size_.size());
        assert(symb < symb_size_.size());

        if (size_ == 0) {
            return nil_id;
        }

        uint64_t key = make_key_(node_id, symb);
        assert(key != 0);

        for (uint64_t i = Hasher::hash(key) & capa_size_.mask();; i = right_(i)) {
            if (i == 0) {
                // table_[0] is always empty so that table_[i] = 0 indicates to be empty.
                continue;
            }
            if (i == get_root()) {
                continue;
            }
            if (table_[i] == 0) {
                // encounter an empty slot
                return nil_id;
            }
            if (table_[i] == key) {
                return i;
            }
        }
    }